

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.cpp
# Opt level: O2

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::apply
          (CPhase<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  Phase<std::complex<float>_> *pPVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_16_2_357f297d f;
  _Vector_base<int,_std::allocator<int>_> local_58;
  anon_class_16_2_357f297d local_40;
  
  (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject[5])(&local_58,this);
  *(ulong *)local_58._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_58._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_58._M_impl.super__Vector_impl_data._M_start);
  iVar1 = (this->super_QControlledGate2<std::complex<float>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[0xf])(this);
  pPVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>._M_head_impl;
  local_40.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_40.lambda._M_value._4_4_ = (float)((uint)(pPVar2->angle_).sin_ ^ (uint)DAT_00118c30);
    local_40.lambda._M_value._0_4_ = (pPVar2->angle_).cos_;
  }
  else {
    local_40.lambda._M_value = *(_ComplexT *)&pPVar2->angle_;
  }
  apply4b<qclab::qgates::lambda_Phase<std::complex<float>>(qclab::Op,std::complex<float>&,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,*local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_start[1],iVar1 + offset,iVar3 + offset,
             (this->super_QControlledGate2<std::complex<float>_>).controlState_,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void CPhase< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }